

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int8_t __thiscall
icu_63::UnicodeString::doCompare
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  UBool UVar1;
  int8_t local_3d;
  int32_t result;
  int8_t lengthResult;
  char16_t *pcStack_38;
  int32_t minLength;
  UChar *chars;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UChar *srcChars_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  srcChars_local._0_4_ = length;
  srcChars_local._4_4_ = start;
  _length_local = this;
  UVar1 = isBogus(this);
  if (UVar1 == '\0') {
    pinIndices(this,(int32_t *)((long)&srcChars_local + 4),(int32_t *)&srcChars_local);
    if (srcChars == (UChar *)0x0) {
      this_local._7_1_ = (int32_t)srcChars_local != 0;
    }
    else {
      pcStack_38 = getArrayStart(this);
      pcStack_38 = pcStack_38 + srcChars_local._4_4_;
      _srcLength_local = srcChars + srcStart;
      chars._0_4_ = srcLength;
      if (srcLength < 0) {
        chars._0_4_ = u_strlen_63(_srcLength_local + srcStart);
      }
      if ((int32_t)srcChars_local == (int32_t)chars) {
        result = (int32_t)srcChars_local;
        local_3d = '\0';
      }
      else if ((int32_t)srcChars_local < (int32_t)chars) {
        result = (int32_t)srcChars_local;
        local_3d = -1;
      }
      else {
        result = (int32_t)chars;
        local_3d = '\x01';
      }
      if ((0 < result) && (pcStack_38 != _srcLength_local)) {
        do {
          if ((uint)(ushort)*pcStack_38 - (uint)(ushort)*_srcLength_local != 0) {
            return (byte)((int)((uint)(ushort)*pcStack_38 - (uint)(ushort)*_srcLength_local) >> 0xf)
                   | 1;
          }
          result = result + -1;
          pcStack_38 = pcStack_38 + 1;
          _srcLength_local = _srcLength_local + 1;
        } while (0 < result);
      }
      this_local._7_1_ = local_3d;
    }
  }
  else {
    this_local._7_1_ = -1;
  }
  return this_local._7_1_;
}

Assistant:

int8_t
UnicodeString::doCompare( int32_t start,
              int32_t length,
              const UChar *srcChars,
              int32_t srcStart,
              int32_t srcLength) const
{
  // compare illegal string values
  if(isBogus()) {
    return -1;
  }
  
  // pin indices to legal values
  pinIndices(start, length);

  if(srcChars == NULL) {
    // treat const UChar *srcChars==NULL as an empty string
    return length == 0 ? 0 : 1;
  }

  // get the correct pointer
  const UChar *chars = getArrayStart();

  chars += start;
  srcChars += srcStart;

  int32_t minLength;
  int8_t lengthResult;

  // get the srcLength if necessary
  if(srcLength < 0) {
    srcLength = u_strlen(srcChars + srcStart);
  }

  // are we comparing different lengths?
  if(length != srcLength) {
    if(length < srcLength) {
      minLength = length;
      lengthResult = -1;
    } else {
      minLength = srcLength;
      lengthResult = 1;
    }
  } else {
    minLength = length;
    lengthResult = 0;
  }

  /*
   * note that uprv_memcmp() returns an int but we return an int8_t;
   * we need to take care not to truncate the result -
   * one way to do this is to right-shift the value to
   * move the sign bit into the lower 8 bits and making sure that this
   * does not become 0 itself
   */

  if(minLength > 0 && chars != srcChars) {
    int32_t result;

#   if U_IS_BIG_ENDIAN 
      // big-endian: byte comparison works
      result = uprv_memcmp(chars, srcChars, minLength * sizeof(UChar));
      if(result != 0) {
        return (int8_t)(result >> 15 | 1);
      }
#   else
      // little-endian: compare UChar units
      do {
        result = ((int32_t)*(chars++) - (int32_t)*(srcChars++));
        if(result != 0) {
          return (int8_t)(result >> 15 | 1);
        }
      } while(--minLength > 0);
#   endif
  }
  return lengthResult;
}